

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

QWindowGeometrySpecification *
QWindowGeometrySpecification::fromArgument
          (QWindowGeometrySpecification *__return_storage_ptr__,QByteArray *a)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  int i;
  int iVar6;
  int iVar7;
  char cVar8;
  long in_FS_OFFSET;
  bool ok;
  QArrayData *local_58 [3];
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __return_storage_ptr__->corner = TopLeftCorner;
  __return_storage_ptr__->xOffset = -1;
  __return_storage_ptr__->yOffset = -1;
  __return_storage_ptr__->width = -1;
  __return_storage_ptr__->height = -1;
  iVar6 = 0;
  iVar7 = 0;
  while( true ) {
    lVar1 = (a->d).size;
    lVar5 = (long)iVar7;
    if (lVar1 <= lVar5) break;
    pcVar2 = (a->d).ptr;
    cVar8 = pcVar2[lVar5];
    if (((cVar8 == '+') || (cVar8 == 'x')) || (cVar8 == '-')) {
      iVar7 = iVar7 + 1;
      lVar5 = (long)iVar7;
    }
    else {
      iVar3 = (int)cVar8;
      cVar8 = 'x';
      if (9 < iVar3 - 0x30U) break;
    }
    if ((lVar5 < lVar1) && ((int)pcVar2[lVar5] - 0x30U < 10)) {
      iVar7 = (int)lVar5;
      do {
        lVar5 = lVar5 + 1;
        if (lVar1 == lVar5) {
          iVar7 = (int)lVar1;
          break;
        }
        iVar7 = iVar7 + 1;
      } while ((int)pcVar2[lVar5] - 0x30U < 10);
    }
    local_39 = -0x56;
    QByteArray::mid((longlong)local_58,(longlong)a);
    iVar3 = QByteArray::toInt((bool *)local_58,(int)&local_39);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],1,0x10);
      }
    }
    if ((iVar3 < 0) || (local_39 == '\0')) break;
    if ((cVar8 == '+') || (cVar8 == '-')) {
      if (__return_storage_ptr__->xOffset < 0) {
        __return_storage_ptr__->xOffset = iVar3;
        if (cVar8 == '-') {
          __return_storage_ptr__->corner = TopRightCorner;
        }
      }
      else {
        __return_storage_ptr__->yOffset = iVar3;
        if (cVar8 == '-') {
          __return_storage_ptr__->corner =
               __return_storage_ptr__->corner == TopRightCorner | BottomLeftCorner;
        }
      }
    }
    else if (cVar8 == 'x') {
      piVar4 = &__return_storage_ptr__->height;
      if (__return_storage_ptr__->width < 0) {
        piVar4 = &__return_storage_ptr__->width;
      }
      *piVar4 = iVar3;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 4) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QWindowGeometrySpecification QWindowGeometrySpecification::fromArgument(const QByteArray &a)
{
    QWindowGeometrySpecification result = Q_WINDOW_GEOMETRY_SPECIFICATION_INITIALIZER;
    int pos = 0;
    for (int i = 0; i < 4; ++i) {
        char op;
        const int value = nextGeometryToken(a, pos, &op);
        if (value < 0)
            break;
        switch (op) {
        case 'x':
            (result.width >= 0 ? result.height : result.width) = value;
            break;
        case '+':
        case '-':
            if (result.xOffset >= 0) {
                result.yOffset = value;
                if (op == '-')
                    result.corner = result.corner == Qt::TopRightCorner ? Qt::BottomRightCorner : Qt::BottomLeftCorner;
            } else {
                result.xOffset = value;
                if (op == '-')
                    result.corner = Qt::TopRightCorner;
            }
        }
    }
    return result;
}